

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIteratorInit(Wal *pWal,u32 nBackfill,WalIterator **pp)

{
  u32 iFrame;
  int iVar1;
  int iVar2;
  sqlite3_uint64 n;
  ht_slot *aBuffer;
  ht_slot *aList;
  uint local_84;
  ht_slot *aIndex;
  int nEntry;
  int j;
  WalHashLoc sLoc;
  int rc;
  ht_slot *aTmp;
  int i;
  sqlite3_int64 nByte;
  u32 iLast;
  int nSegment;
  WalIterator *p;
  WalIterator **pp_local;
  u32 nBackfill_local;
  Wal *pWal_local;
  
  sLoc._20_4_ = 0;
  iFrame = (pWal->hdr).mxFrame;
  iVar1 = walFramePage(iFrame);
  iVar2 = iVar1 + 1;
  n = (long)iVar1 * 0x20 + 0x28 + (ulong)iFrame * 2;
  _iLast = (WalIterator *)sqlite3_malloc64(n);
  if (_iLast == (WalIterator *)0x0) {
    pWal_local._4_4_ = 7;
  }
  else {
    memset(_iLast,0,n);
    _iLast->nSegment = iVar2;
    local_84 = iFrame;
    if (0x1000 < iFrame) {
      local_84 = 0x1000;
    }
    aBuffer = (ht_slot *)sqlite3_malloc64((ulong)local_84 << 1);
    if (aBuffer == (ht_slot *)0x0) {
      sLoc._20_4_ = 7;
    }
    for (aTmp._4_4_ = walFramePage(nBackfill + 1); sLoc._20_4_ == 0 && aTmp._4_4_ < iVar2;
        aTmp._4_4_ = aTmp._4_4_ + 1) {
      sLoc._20_4_ = walHashGet(pWal,aTmp._4_4_,(WalHashLoc *)&nEntry);
      if (sLoc._20_4_ == 0) {
        if (aTmp._4_4_ + 1 == iVar2) {
          aIndex._0_4_ = iFrame - (uint)sLoc.aPgno;
        }
        else {
          aIndex._0_4_ = (int)((long)_nEntry - (long)sLoc.aHash >> 2);
        }
        aList = (ht_slot *)
                ((long)&_iLast->aSegment[_iLast->nSegment].iNext + (ulong)(uint)sLoc.aPgno * 2);
        sLoc.aPgno._0_4_ = (uint)sLoc.aPgno + 1;
        for (aIndex._4_4_ = 0; aIndex._4_4_ < (int)aIndex; aIndex._4_4_ = aIndex._4_4_ + 1) {
          aList[aIndex._4_4_] = (ht_slot)aIndex._4_4_;
        }
        walMergesort((u32 *)sLoc.aHash,aBuffer,aList,(int *)&aIndex);
        _iLast->aSegment[aTmp._4_4_].iZero = (uint)sLoc.aPgno;
        _iLast->aSegment[aTmp._4_4_].nEntry = (int)aIndex;
        _iLast->aSegment[aTmp._4_4_].aIndex = aList;
        _iLast->aSegment[aTmp._4_4_].aPgno = (u32 *)sLoc.aHash;
      }
    }
    sqlite3_free(aBuffer);
    if (sLoc._20_4_ != 0) {
      walIteratorFree(_iLast);
      _iLast = (WalIterator *)0x0;
    }
    *pp = _iLast;
    pWal_local._4_4_ = sLoc._20_4_;
  }
  return pWal_local._4_4_;
}

Assistant:

static int walIteratorInit(Wal *pWal, u32 nBackfill, WalIterator **pp){
  WalIterator *p;                 /* Return value */
  int nSegment;                   /* Number of segments to merge */
  u32 iLast;                      /* Last frame in log */
  sqlite3_int64 nByte;            /* Number of bytes to allocate */
  int i;                          /* Iterator variable */
  ht_slot *aTmp;                  /* Temp space used by merge-sort */
  int rc = SQLITE_OK;             /* Return Code */

  /* This routine only runs while holding the checkpoint lock. And
  ** it only runs if there is actually content in the log (mxFrame>0).
  */
  assert( pWal->ckptLock && pWal->hdr.mxFrame>0 );
  iLast = pWal->hdr.mxFrame;

  /* Allocate space for the WalIterator object. */
  nSegment = walFramePage(iLast) + 1;
  nByte = sizeof(WalIterator)
        + (nSegment-1)*sizeof(struct WalSegment)
        + iLast*sizeof(ht_slot);
  p = (WalIterator *)sqlite3_malloc64(nByte);
  if( !p ){
    return SQLITE_NOMEM_BKPT;
  }
  memset(p, 0, nByte);
  p->nSegment = nSegment;

  /* Allocate temporary space used by the merge-sort routine. This block
  ** of memory will be freed before this function returns.
  */
  aTmp = (ht_slot *)sqlite3_malloc64(
      sizeof(ht_slot) * (iLast>HASHTABLE_NPAGE?HASHTABLE_NPAGE:iLast)
  );
  if( !aTmp ){
    rc = SQLITE_NOMEM_BKPT;
  }

  for(i=walFramePage(nBackfill+1); rc==SQLITE_OK && i<nSegment; i++){
    WalHashLoc sLoc;

    rc = walHashGet(pWal, i, &sLoc);
    if( rc==SQLITE_OK ){
      int j;                      /* Counter variable */
      int nEntry;                 /* Number of entries in this segment */
      ht_slot *aIndex;            /* Sorted index for this segment */

      if( (i+1)==nSegment ){
        nEntry = (int)(iLast - sLoc.iZero);
      }else{
        nEntry = (int)((u32*)sLoc.aHash - (u32*)sLoc.aPgno);
      }
      aIndex = &((ht_slot *)&p->aSegment[p->nSegment])[sLoc.iZero];
      sLoc.iZero++;

      for(j=0; j<nEntry; j++){
        aIndex[j] = (ht_slot)j;
      }
      walMergesort((u32 *)sLoc.aPgno, aTmp, aIndex, &nEntry);
      p->aSegment[i].iZero = sLoc.iZero;
      p->aSegment[i].nEntry = nEntry;
      p->aSegment[i].aIndex = aIndex;
      p->aSegment[i].aPgno = (u32 *)sLoc.aPgno;
    }
  }
  sqlite3_free(aTmp);

  if( rc!=SQLITE_OK ){
    walIteratorFree(p);
    p = 0;
  }
  *pp = p;
  return rc;
}